

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall wabt::SharedValidator::OnElse(SharedValidator *this,Location *loc)

{
  Result rhs;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  Result::Result((Result *)((long)&this_local + 4),Ok);
  rhs = TypeChecker::OnElse(&this->typechecker_);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnElse(const Location& loc) {
  // Don't call CheckInstr or update expr_loc_ here because if we fail we want
  // the last expression in the If block to be reported as the error location,
  // not the else itself.
  Result result = Result::Ok;
  result |= typechecker_.OnElse();
  return result;
}